

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

QStringList * __thiscall QProcessEnvironmentPrivate::keys(QProcessEnvironmentPrivate *this)

{
  long lVar1;
  bool bVar2;
  QProcessEnvironmentPrivate *this_00;
  Key *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringList *result;
  const_iterator end;
  const_iterator it;
  rvalue_ref in_stack_ffffffffffffff58;
  QList<QString> *in_stack_ffffffffffffff60;
  QList<QString> *in_stack_ffffffffffffffa8;
  qsizetype in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x78e89f);
  this_00 = (QProcessEnvironmentPrivate *)
            QMap<QByteArray,_QProcEnvValue>::size
                      ((QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff60);
  QList<QString>::reserve(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffe8);
  QMap<QByteArray,_QProcEnvValue>::constBegin
            ((QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff58);
  QMap<QByteArray,_QProcEnvValue>::constEnd
            ((QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff58);
  while (bVar2 = ::operator!=((const_iterator *)in_stack_ffffffffffffff60,
                              (const_iterator *)in_stack_ffffffffffffff58), bVar2) {
    QMap<QByteArray,_QProcEnvValue>::const_iterator::key((const_iterator *)0x78e962);
    nameToString(this_00,in_RSI);
    QList<QString>::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QString::~QString((QString *)0x78e99a);
    QMap<QByteArray,_QProcEnvValue>::const_iterator::operator++
              ((const_iterator *)in_stack_ffffffffffffff60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QProcessEnvironmentPrivate::keys() const
{
    QStringList result;
    result.reserve(vars.size());
    auto it = vars.constBegin();
    const auto end = vars.constEnd();
    for ( ; it != end; ++it)
        result << nameToString(it.key());
    return result;
}